

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::variable_decl_is_remapped_storage
          (CompilerMSL *this,SPIRVariable *variable,StorageClass storage)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  byte local_3b;
  byte local_3a;
  bool local_39;
  BuiltIn builtin;
  StorageClass storage_local;
  SPIRVariable *variable_local;
  CompilerMSL *this_local;
  
  if (variable->storage == storage) {
    this_local._7_1_ = true;
  }
  else if (storage == StorageClassWorkgroup) {
    bVar1 = is_tesc_shader(this);
    if ((bVar1) && (variable->storage == Output)) {
      uVar2 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(variable->super_IVariant).field_0xc);
      pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
      bVar1 = Compiler::has_decoration((Compiler *)this,(ID)(pSVar3->super_IVariant).self.id,Block);
      if (bVar1) {
        return true;
      }
    }
    local_39 = false;
    if (variable->storage == Output) {
      bVar1 = is_tesc_shader(this);
      local_39 = false;
      if (bVar1) {
        local_39 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,variable)
        ;
      }
    }
    this_local._7_1_ = local_39;
  }
  else if (storage == StorageBuffer) {
    uVar2 = Compiler::get_decoration
                      ((Compiler *)this,(ID)(variable->super_IVariant).self.id,BuiltIn);
    bVar1 = is_tese_shader(this);
    if (((bVar1) && (bVar1 = Compiler::is_builtin_variable((Compiler *)this,variable), bVar1)) &&
       ((uVar2 == 0xd || (uVar2 == 7)))) {
      this_local._7_1_ = false;
    }
    else {
      if ((variable->storage == Output) || (local_3a = 0, variable->storage == Input)) {
        bVar1 = variable_storage_requires_stage_io(this,variable->storage);
        local_3a = 0;
        if (!bVar1) {
          local_3b = 1;
          if (variable->storage == Output) {
            bVar1 = CompilerGLSL::is_stage_output_variable_masked
                              (&this->super_CompilerGLSL,variable);
            local_3b = bVar1 ^ 0xff;
          }
          local_3a = local_3b;
        }
      }
      this_local._7_1_ = (bool)(local_3a & 1);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerMSL::variable_decl_is_remapped_storage(const SPIRVariable &variable, spv::StorageClass storage) const
{
	if (variable.storage == storage)
		return true;

	if (storage == StorageClassWorkgroup)
	{
		// Specially masked IO block variable.
		// Normally, we will never access IO blocks directly here.
		// The only scenario which that should occur is with a masked IO block.
		if (is_tesc_shader() && variable.storage == StorageClassOutput &&
		    has_decoration(get<SPIRType>(variable.basetype).self, DecorationBlock))
		{
			return true;
		}

		return variable.storage == StorageClassOutput && is_tesc_shader() && is_stage_output_variable_masked(variable);
	}
	else if (storage == StorageClassStorageBuffer)
	{
		// These builtins are passed directly; we don't want to use remapping
		// for them.
		auto builtin = (BuiltIn)get_decoration(variable.self, DecorationBuiltIn);
		if (is_tese_shader() && is_builtin_variable(variable) && (builtin == BuiltInTessCoord || builtin == BuiltInPrimitiveId))
			return false;

		// We won't be able to catch writes to control point outputs here since variable
		// refers to a function local pointer.
		// This is fine, as there cannot be concurrent writers to that memory anyways,
		// so we just ignore that case.

		return (variable.storage == StorageClassOutput || variable.storage == StorageClassInput) &&
		       !variable_storage_requires_stage_io(variable.storage) &&
		       (variable.storage != StorageClassOutput || !is_stage_output_variable_masked(variable));
	}
	else
	{
		return false;
	}
}